

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msdfgen.cpp
# Opt level: O0

void msdfgen::generatePseudoSDF
               (Bitmap<float> *output,Shape *shape,double range,Vector2 *scale,Vector2 *translate)

{
  SignedDistance b;
  SignedDistance a;
  EdgeHolder *pEVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  pointer pCVar6;
  reference this;
  reference pvVar7;
  EdgeSegment *pEVar8;
  reference pvVar9;
  float *pfVar10;
  EdgeHolder *extraout_XMM0_Qa;
  double dVar11;
  Vector2 VVar12;
  int local_1cc;
  int local_1ac;
  int local_1a8;
  int i_3;
  int i_2;
  int i_1;
  double psd;
  SignedDistance distance;
  double param;
  __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
  local_130;
  const_iterator edge;
  double nearParam;
  EdgeHolder *nearEdge;
  SignedDistance minDistance;
  const_iterator cStack_100;
  int i;
  const_iterator contour_1;
  EdgeHolder *pEStack_f0;
  int winding;
  double posDist;
  double negDist;
  double sd;
  Vector2 local_c8;
  double dStack_b8;
  Point2 p;
  int x;
  int row;
  int y;
  vector<double,_std::allocator<double>_> contourSD;
  __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
  local_78;
  __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
  local_70;
  const_iterator contour;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> windings;
  int h;
  int w;
  int contourCount;
  Vector2 *translate_local;
  Vector2 *scale_local;
  double range_local;
  Shape *shape_local;
  Bitmap<float> *output_local;
  
  sVar5 = std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::size(&shape->contours);
  iVar3 = (int)sVar5;
  iVar4 = Bitmap<float>::width(output);
  windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = Bitmap<float>::height(output);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_58);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_58,(long)iVar3);
  local_70._M_current =
       (Contour *)
       std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::begin(&shape->contours);
  while( true ) {
    local_78._M_current =
         (Contour *)
         std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::end(&shape->contours);
    bVar2 = __gnu_cxx::operator!=(&local_70,&local_78);
    if (!bVar2) break;
    pCVar6 = __gnu_cxx::
             __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
             ::operator->(&local_70);
    contourSD.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = Contour::winding(pCVar6);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_58,
               (value_type_conflict *)
               ((long)&contourSD.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
    __gnu_cxx::
    __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
    ::operator++(&local_70);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&row);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)&row,(long)iVar3);
  for (x = 0; x < windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_; x = x + 1) {
    if ((shape->inverseYAxis & 1U) == 0) {
      local_1cc = x;
    }
    else {
      local_1cc = (windings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ - x) + -1;
    }
    for (p.y._4_4_ = 0; p.y._4_4_ < iVar4; p.y._4_4_ = p.y._4_4_ + 1) {
      Vector2::Vector2((Vector2 *)&sd,(double)p.y._4_4_ + 0.5,(double)x + 0.5);
      VVar12 = Vector2::operator/((Vector2 *)&sd,scale);
      local_c8 = VVar12;
      VVar12 = Vector2::operator-(&local_c8,translate);
      p.x = VVar12.y;
      dStack_b8 = VVar12.x;
      negDist = (double)SignedDistance::INFINITE;
      posDist = -(double)SignedDistance::INFINITE;
      pEStack_f0 = SignedDistance::INFINITE;
      contour_1._M_current._4_4_ = 0;
      cStack_100 = std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::begin
                             (&shape->contours);
      minDistance.dot._4_4_ = 0;
      while (minDistance.dot._4_4_ < iVar3) {
        SignedDistance::SignedDistance((SignedDistance *)&nearEdge);
        nearParam = 0.0;
        edge._M_current = (EdgeHolder *)0x0;
        pCVar6 = __gnu_cxx::
                 __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                 ::operator->(&stack0xffffffffffffff00);
        local_130._M_current =
             (EdgeHolder *)
             std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::begin
                       (&pCVar6->edges);
        while( true ) {
          pCVar6 = __gnu_cxx::
                   __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
                   ::operator->(&stack0xffffffffffffff00);
          param = (double)std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::
                          end(&pCVar6->edges);
          bVar2 = __gnu_cxx::operator!=
                            (&local_130,
                             (__normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                              *)&param);
          if (!bVar2) break;
          this = __gnu_cxx::
                 __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                 ::operator*(&local_130);
          pEVar8 = EdgeHolder::operator->(this);
          dVar11 = p.x;
          (*pEVar8->_vptr_EdgeSegment[5])(dStack_b8,pEVar8,&distance.dot);
          a.dot = dVar11;
          a.distance = (double)extraout_XMM0_Qa;
          b.dot = minDistance.distance;
          b.distance = (double)nearEdge;
          distance.distance = dVar11;
          bVar2 = operator<(a,b);
          if (bVar2) {
            minDistance.distance = distance.distance;
            nearEdge = extraout_XMM0_Qa;
            nearParam = (double)__gnu_cxx::
                                __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                                ::operator*(&local_130);
            edge._M_current = (EdgeHolder *)distance.dot;
          }
          __gnu_cxx::
          __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
          ::operator++(&local_130);
        }
        if (ABS((double)nearEdge) < ABS(negDist)) {
          negDist = (double)nearEdge;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_58,
                              (long)minDistance.dot._4_4_);
          contour_1._M_current._4_4_ = -*pvVar7;
        }
        if (nearParam != 0.0) {
          pEVar8 = EdgeHolder::operator->((EdgeHolder *)nearParam);
          (*pEVar8->_vptr_EdgeSegment[6])(dStack_b8,p.x,(int)edge._M_current,pEVar8,&nearEdge);
        }
        pEVar1 = nearEdge;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&row,
                            (long)minDistance.dot._4_4_);
        *pvVar9 = (value_type)pEVar1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_58,
                            (long)minDistance.dot._4_4_);
        if (((0 < *pvVar7) && (0.0 <= (double)nearEdge)) &&
           (ABS((double)nearEdge) < ABS((double)pEStack_f0))) {
          pEStack_f0 = nearEdge;
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_58,
                            (long)minDistance.dot._4_4_);
        if (((*pvVar7 < 0) && ((double)nearEdge <= 0.0)) && (ABS((double)nearEdge) < ABS(posDist)))
        {
          posDist = (double)nearEdge;
        }
        minDistance.dot._4_4_ = minDistance.dot._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<const_msdfgen::Contour_*,_std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>_>
        ::operator++(&stack0xffffffffffffff00);
      }
      _i_2 = SignedDistance::INFINITE;
      if (((double)pEStack_f0 < 0.0) || (ABS(posDist) < ABS((double)pEStack_f0))) {
        if ((posDist <= 0.0) && (ABS(posDist) <= ABS((double)pEStack_f0))) {
          _i_2 = (EdgeHolder *)posDist;
          contour_1._M_current._4_4_ = -1;
          for (local_1a8 = 0; local_1a8 < iVar3; local_1a8 = local_1a8 + 1) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_58,(long)local_1a8);
            if (*pvVar7 < 0) {
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)&row,(long)local_1a8);
              if (*pvVar9 < (double)_i_2) {
                pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)&row,(long)local_1a8)
                ;
                if (ABS(*pvVar9) < ABS((double)pEStack_f0)) {
                  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                     ((vector<double,_std::allocator<double>_> *)&row,
                                      (long)local_1a8);
                  _i_2 = (EdgeHolder *)*pvVar9;
                }
              }
            }
          }
        }
      }
      else {
        _i_2 = pEStack_f0;
        contour_1._M_current._4_4_ = 1;
        for (i_3 = 0; i_3 < iVar3; i_3 = i_3 + 1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_58,(long)i_3);
          if (0 < *pvVar7) {
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)&row,(long)i_3);
            if ((double)_i_2 < *pvVar9) {
              pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)&row,(long)i_3);
              if (ABS(*pvVar9) < ABS(posDist)) {
                pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)&row,(long)i_3);
                _i_2 = (EdgeHolder *)*pvVar9;
              }
            }
          }
        }
      }
      for (local_1ac = 0; local_1ac < iVar3; local_1ac = local_1ac + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_58,(long)local_1ac);
        if (*pvVar7 != contour_1._M_current._4_4_) {
          pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&row,(long)local_1ac);
          if (ABS(*pvVar9) < ABS((double)_i_2)) {
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)&row,(long)local_1ac);
            _i_2 = (EdgeHolder *)*pvVar9;
          }
        }
      }
      pfVar10 = Bitmap<float>::operator()(output,p.y._4_4_,local_1cc);
      *pfVar10 = (float)((double)_i_2 / range + 0.5);
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&row);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
  return;
}

Assistant:

void generatePseudoSDF(Bitmap<float> &output, const Shape &shape, double range, const Vector2 &scale, const Vector2 &translate) {
    int contourCount = shape.contours.size();
    int w = output.width(), h = output.height();
    std::vector<int> windings;
    windings.reserve(contourCount);
    for (std::vector<Contour>::const_iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour)
        windings.push_back(contour->winding());

#ifdef MSDFGEN_USE_OPENMP
    #pragma omp parallel
#endif
    {
        std::vector<double> contourSD;
        contourSD.resize(contourCount);
#ifdef MSDFGEN_USE_OPENMP
        #pragma omp for
#endif
        for (int y = 0; y < h; ++y) {
            int row = shape.inverseYAxis ? h-y-1 : y;
            for (int x = 0; x < w; ++x) {
                Point2 p = Vector2(x+.5, y+.5)/scale-translate;
                double sd = SignedDistance::INFINITE.distance;
                double negDist = -SignedDistance::INFINITE.distance;
                double posDist = SignedDistance::INFINITE.distance;
                int winding = 0;

                std::vector<Contour>::const_iterator contour = shape.contours.begin();
                for (int i = 0; i < contourCount; ++i, ++contour) {
                    SignedDistance minDistance;
                    const EdgeHolder *nearEdge = NULL;
                    double nearParam = 0;
                    for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge) {
                        double param;
                        SignedDistance distance = (*edge)->signedDistance(p, param);
                        if (distance < minDistance) {
                            minDistance = distance;
                            nearEdge = &*edge;
                            nearParam = param;
                        }
                    }
                    if (fabs(minDistance.distance) < fabs(sd)) {
                        sd = minDistance.distance;
                        winding = -windings[i];
                    }
                    if (nearEdge)
                        (*nearEdge)->distanceToPseudoDistance(minDistance, p, nearParam);
                    contourSD[i] = minDistance.distance;
                    if (windings[i] > 0 && minDistance.distance >= 0 && fabs(minDistance.distance) < fabs(posDist))
                        posDist = minDistance.distance;
                    if (windings[i] < 0 && minDistance.distance <= 0 && fabs(minDistance.distance) < fabs(negDist))
                        negDist = minDistance.distance;
                }

                double psd = SignedDistance::INFINITE.distance;
                if (posDist >= 0 && fabs(posDist) <= fabs(negDist)) {
                    psd = posDist;
                    winding = 1;
                    for (int i = 0; i < contourCount; ++i)
                        if (windings[i] > 0 && contourSD[i] > psd && fabs(contourSD[i]) < fabs(negDist))
                            psd = contourSD[i];
                } else if (negDist <= 0 && fabs(negDist) <= fabs(posDist)) {
                    psd = negDist;
                    winding = -1;
                    for (int i = 0; i < contourCount; ++i)
                        if (windings[i] < 0 && contourSD[i] < psd && fabs(contourSD[i]) < fabs(posDist))
                            psd = contourSD[i];
                }
                for (int i = 0; i < contourCount; ++i)
                    if (windings[i] != winding && fabs(contourSD[i]) < fabs(psd))
                        psd = contourSD[i];

                output(x, row) = float(psd/range+.5);
            }
        }
    }
}